

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::func_type_decl_abi_cxx11_(CompilerMSL *this,SPIRType *type)

{
  ExecutionModel EVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  CompilerError *pCVar5;
  undefined8 in_RDX;
  char *pcVar6;
  char *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [32];
  char *local_170;
  spirv_cross local_168 [32];
  char *local_148;
  spirv_cross local_140 [32];
  SPIREntryPoint *local_120;
  SPIREntryPoint *execution;
  string entry_type;
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [39];
  byte local_91;
  undefined4 local_90;
  bool ep_should_return_output;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string return_type;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  (*(type->super_IVariant)._vptr_IVariant[0x13])(local_60,type,in_RDX);
  (*(type->super_IVariant)._vptr_IVariant[0x27])(local_80,type,in_RDX);
  ::std::operator+(local_40,local_60);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string((string *)local_60);
  if (((ulong)type[0x17].array_size_literal.super_VectorView<bool>.ptr & 1) == 0) {
    ::std::__cxx11::string::string((string *)this,(string *)local_40);
    local_90 = 1;
    goto LAB_002e315c;
  }
  bVar2 = get_is_rasterization_disabled((CompilerMSL *)type);
  local_91 = ~bVar2 & 1;
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&type[0x1f].member_name_cache._M_h._M_before_begin);
  if ((uVar3 != 0) && ((local_91 & 1) != 0)) {
    pSVar4 = get_stage_out_struct_type((CompilerMSL *)type);
    (*(type->super_IVariant)._vptr_IVariant[0x13])(local_d8,type,pSVar4);
    (*(type->super_IVariant)._vptr_IVariant[0x27])(local_f8,type,in_RDX);
    ::std::operator+(local_b8,local_d8);
    ::std::__cxx11::string::operator=((string *)local_40,(string *)local_b8);
    ::std::__cxx11::string::~string((string *)local_b8);
    ::std::__cxx11::string::~string(local_f8);
    ::std::__cxx11::string::~string((string *)local_d8);
  }
  ::std::__cxx11::string::string((string *)&execution);
  local_120 = Compiler::get_entry_point((Compiler *)type);
  EVar1 = local_120->model;
  if (EVar1 == ExecutionModelVertex) {
    if (((type[0x1c].member_name_cache._M_h._M_element_count & 0x100000000000000) != 0) &&
       (bVar2 = Options::supports_msl_version
                          ((Options *)
                           ((long)&type[0x1c].member_type_index_redirection.
                                   super_VectorView<unsigned_int>.ptr + 4),1,2,0), !bVar2)) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Tessellation requires Metal 1.2.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((type[0x1c].member_name_cache._M_h._M_element_count & 0x100000000000000) == 0) {
      local_1e0 = "vertex";
    }
    else {
      local_1e0 = "kernel";
    }
    ::std::__cxx11::string::operator=((string *)&execution,local_1e0);
  }
  else if (EVar1 == ExecutionModelTessellationControl) {
    bVar2 = Options::supports_msl_version
                      ((Options *)
                       ((long)&type[0x1c].member_type_index_redirection.
                               super_VectorView<unsigned_int>.ptr + 4),1,2,0);
    if (!bVar2) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Tessellation requires Metal 1.2.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar2 = Bitset::get(&local_120->flags,0x19);
    if (bVar2) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Metal does not support isoline tessellation.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
LAB_002e307e:
    ::std::__cxx11::string::operator=((string *)&execution,"kernel");
  }
  else if (EVar1 == ExecutionModelTessellationEvaluation) {
    bVar2 = Options::supports_msl_version
                      ((Options *)
                       ((long)&type[0x1c].member_type_index_redirection.
                               super_VectorView<unsigned_int>.ptr + 4),1,2,0);
    if (!bVar2) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Tessellation requires Metal 1.2.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar2 = Bitset::get(&local_120->flags,0x19);
    if (bVar2) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Metal does not support isoline tessellation.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar2 = Options::is_ios((Options *)
                            ((long)&type[0x1c].member_type_index_redirection.
                                    super_VectorView<unsigned_int>.ptr + 4));
    if (bVar2) {
      bVar2 = Compiler::is_tessellating_triangles((Compiler *)type);
      local_148 = "quad";
      if (bVar2) {
        local_148 = "triangle";
      }
      join<char_const(&)[10],char_const*,char_const(&)[12]>
                (local_140,(char (*) [10])"[[ patch(",&local_148,(char (*) [12])") ]] vertex");
      ::std::__cxx11::string::operator=((string *)&execution,(string *)local_140);
      ::std::__cxx11::string::~string((string *)local_140);
    }
    else {
      bVar2 = Compiler::is_tessellating_triangles((Compiler *)type);
      local_170 = "quad";
      if (bVar2) {
        local_170 = "triangle";
      }
      join<char_const(&)[10],char_const*,char_const(&)[3],unsigned_int&,char_const(&)[12]>
                (local_168,(char (*) [10])"[[ patch(",&local_170,(char (*) [3])0x421228,
                 &local_120->output_vertices,(char (*) [12])") ]] vertex");
      ::std::__cxx11::string::operator=((string *)&execution,(string *)local_168);
      ::std::__cxx11::string::~string((string *)local_168);
    }
  }
  else if (EVar1 == ExecutionModelFragment) {
    bVar2 = uses_explicit_early_fragment_test((CompilerMSL *)type);
    pcVar6 = "fragment";
    if (bVar2) {
      pcVar6 = "[[ early_fragment_tests ]] fragment";
    }
    ::std::__cxx11::string::operator=((string *)&execution,pcVar6);
  }
  else {
    if (EVar1 - ExecutionModelGLCompute < 2) goto LAB_002e307e;
    if (EVar1 == ExecutionModelTaskEXT) {
      ::std::__cxx11::string::operator=((string *)&execution,"[[object]]");
    }
    else if (EVar1 == ExecutionModelMeshEXT) {
      ::std::__cxx11::string::operator=((string *)&execution,"[[mesh]]");
    }
    else {
      ::std::__cxx11::string::operator=((string *)&execution,"unknown");
    }
  }
  ::std::operator+(local_190,(char *)&execution);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   local_190);
  ::std::__cxx11::string::~string((string *)local_190);
  local_90 = 1;
  ::std::__cxx11::string::~string((string *)&execution);
LAB_002e315c:
  ::std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

string CompilerMSL::func_type_decl(SPIRType &type)
{
	// The regular function return type. If not processing the entry point function, that's all we need
	string return_type = type_to_glsl(type) + type_to_array_glsl(type, 0);
	if (!processing_entry_point)
		return return_type;

	// If an outgoing interface block has been defined, and it should be returned, override the entry point return type
	bool ep_should_return_output = !get_is_rasterization_disabled();
	if (stage_out_var_id && ep_should_return_output)
		return_type = type_to_glsl(get_stage_out_struct_type()) + type_to_array_glsl(type, 0);

	// Prepend a entry type, based on the execution model
	string entry_type;
	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (msl_options.vertex_for_tessellation && !msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		entry_type = msl_options.vertex_for_tessellation ? "kernel" : "vertex";
		break;
	case ExecutionModelTessellationEvaluation:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		if (msl_options.is_ios())
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ") ]] vertex");
		else
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ", ",
			                  execution.output_vertices, ") ]] vertex");
		break;
	case ExecutionModelFragment:
		entry_type = uses_explicit_early_fragment_test() ? "[[ early_fragment_tests ]] fragment" : "fragment";
		break;
	case ExecutionModelTessellationControl:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		/* fallthrough */
	case ExecutionModelGLCompute:
	case ExecutionModelKernel:
		entry_type = "kernel";
		break;
	case ExecutionModelMeshEXT:
		entry_type = "[[mesh]]";
		break;
	case ExecutionModelTaskEXT:
		entry_type = "[[object]]";
		break;
	default:
		entry_type = "unknown";
		break;
	}

	return entry_type + " " + return_type;
}